

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringPool.cpp
# Opt level: O0

uint __thiscall xercesc_4_0::XMLStringPool::addNewEntry(XMLStringPool *this,XMLCh *newString)

{
  int iVar1;
  undefined4 extraout_var;
  PoolElem *valueToAdopt;
  XMLCh *pXVar2;
  ulong uVar3;
  PoolElem *newElem;
  PoolElem **newMap;
  uint newCap;
  XMLCh *newString_local;
  XMLStringPool *this_local;
  PoolElem **__s;
  undefined4 extraout_var_00;
  
  if (this->fCurId == this->fMapCapacity) {
    uVar3 = (ulong)((double)this->fMapCapacity * 1.5);
    iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])();
    __s = (PoolElem **)CONCAT44(extraout_var,iVar1);
    memset(__s,0,(uVar3 & 0xffffffff) << 3);
    memcpy(__s,this->fIdMap,(ulong)this->fMapCapacity << 3);
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fIdMap);
    this->fIdMap = __s;
    this->fMapCapacity = (uint)uVar3;
  }
  iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,0x10);
  valueToAdopt = (PoolElem *)CONCAT44(extraout_var_00,iVar1);
  valueToAdopt->fId = this->fCurId;
  pXVar2 = XMLString::replicate(newString,this->fMemoryManager);
  valueToAdopt->fString = pXVar2;
  RefHashTableOf<xercesc_4_0::XMLStringPool::PoolElem,_xercesc_4_0::StringHasher>::put
            (this->fHashTable,valueToAdopt->fString,valueToAdopt);
  this->fIdMap[this->fCurId] = valueToAdopt;
  this->fCurId = this->fCurId + 1;
  return valueToAdopt->fId;
}

Assistant:

unsigned int XMLStringPool::addNewEntry(const XMLCh* const newString)
{
    // See if we need to expand the id map
    if (fCurId == fMapCapacity)
    {
        // Calculate the new capacity, create a temp new map, and zero it
        const unsigned int newCap = (unsigned int)(fMapCapacity * 1.5);
        PoolElem** newMap = (PoolElem**) fMemoryManager->allocate
        (
            newCap * sizeof(PoolElem*)
        ); //new PoolElem*[newCap];
        memset(newMap, 0, sizeof(PoolElem*) * newCap);

        //
        //  Copy over the old elements from the old map. They are just pointers
        //  so we can do it all at once.
        //
        memcpy(newMap, fIdMap, sizeof(PoolElem*) * fMapCapacity);

        // Clean up the old map and store the new info
        fMemoryManager->deallocate(fIdMap); //delete [] fIdMap;
        fIdMap = newMap;
        fMapCapacity = newCap;
    }

    //
    //  Ok, now create a new element and add it to the hash table. Then store
    //  this new element in the id map at the current id index, then bump the
    //  id index.
    //
    PoolElem* newElem = (PoolElem*) fMemoryManager->allocate(sizeof(PoolElem));
    newElem->fId      = fCurId;
    newElem->fString  = XMLString::replicate(newString, fMemoryManager);
    fHashTable->put((void*)newElem->fString, newElem);
    fIdMap[fCurId] = newElem;

    // Bump the current id and return the id of the new elem we just added
    fCurId++;
    return newElem->fId;
}